

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O3

void __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::parseCurrentNode
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  long lVar4;
  char *pcVar5;
  
  pcVar2 = this->P;
  lVar4 = 0;
  pcVar5 = pcVar2;
  while( true ) {
    if (*pcVar5 == '\0') {
      return;
    }
    if (*pcVar5 == '<') break;
    pcVar5 = pcVar5 + 1;
    this->P = pcVar5;
    lVar4 = lVar4 + 1;
  }
  if (0 < lVar4) {
    bVar3 = setText(this,pcVar2,pcVar5);
    if (bVar3) {
      return;
    }
    pcVar5 = this->P;
  }
  this->P = pcVar5 + 1;
  cVar1 = pcVar5[1];
  if (cVar1 == '!') {
    bVar3 = parseCDATA(this);
    if (bVar3) {
      return;
    }
    parseComment(this);
    return;
  }
  if (cVar1 == '?') {
    this->CurrentNodeType = EXN_UNKNOWN;
    if (pcVar5[1] != '>') {
      pcVar2 = pcVar5 + 2;
      do {
        pcVar5 = pcVar2;
        this->P = pcVar5;
        pcVar2 = pcVar5 + 1;
      } while (*pcVar5 != '>');
      pcVar5 = pcVar5 + -1;
    }
    this->P = pcVar5 + 2;
    return;
  }
  if (cVar1 != '/') {
    parseOpeningXMLElement(this);
    return;
  }
  parseClosingXMLElement(this);
  return;
}

Assistant:

void parseCurrentNode()
	{
		char_type* start = P;

		// move forward until '<' found
		while(*P != L'<' && *P)
			++P;

		if (!*P)
			return;

		if (P - start > 0)
		{
			// we found some text, store it
			if (setText(start, P))
				return;
		}

		++P;

		// based on current token, parse and report next element
		switch(*P)
		{
		case L'/':
			parseClosingXMLElement(); 
			break;
		case L'?':
			ignoreDefinition();	
			break;
		case L'!':
			if (!parseCDATA())
				parseComment();	
			break;
		default:
			parseOpeningXMLElement();
			break;
		}
	}